

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O0

BoundsCheck *
wasm::makeArrayBoundsCheck
          (BoundsCheck *__return_storage_ptr__,Expression *ref,Expression *index,Function *func,
          Builder *builder,Expression *length)

{
  bool bVar1;
  Index index_00;
  Index index_01;
  Index index_02;
  LocalSet *pLVar2;
  ArrayLen *right;
  Binary *pBVar3;
  LocalGet *pLVar4;
  LocalSet *teeLength;
  LocalGet *pLStack_98;
  Index tempLength;
  Expression *getLength;
  Expression *effectiveIndex;
  ArrayLen *getSize;
  LocalSet *teeIndex;
  LocalSet *teeRef;
  Index tempIndex;
  Index tempRef;
  Type local_38;
  Type refType;
  Expression *length_local;
  Builder *builder_local;
  Function *func_local;
  Expression *index_local;
  Expression *ref_local;
  
  local_38.id = (ref->type).id;
  refType.id = (uintptr_t)length;
  bVar1 = Type::isExact(&local_38);
  if (bVar1) {
    local_38 = Type::with(&local_38,Inexact);
  }
  index_00 = Builder::addVar(func,local_38);
  index_01 = Builder::addVar(func,(Type)(index->type).id);
  pLVar2 = Builder::makeLocalTee(builder,index_00,ref,local_38);
  getLength = (Expression *)Builder::makeLocalTee(builder,index_01,index,(Type)(index->type).id);
  right = Builder::makeArrayLen(builder,(Expression *)pLVar2);
  pLStack_98 = (LocalGet *)0x0;
  if (refType.id != 0) {
    index_02 = Builder::addVar(func,(Type)*(uintptr_t *)(refType.id + 8));
    pLVar2 = Builder::makeLocalTee
                       (builder,index_02,(Expression *)refType.id,
                        (Type)*(uintptr_t *)(refType.id + 8));
    getLength = (Expression *)Builder::makeBinary(builder,AddInt32,getLength,(Expression *)pLVar2);
    pLStack_98 = Builder::makeLocalGet(builder,index_02,(Type)*(uintptr_t *)(refType.id + 8));
  }
  pBVar3 = Builder::makeBinary(builder,LtUInt32,getLength,(Expression *)right);
  __return_storage_ptr__->condition = (Expression *)pBVar3;
  pLVar4 = Builder::makeLocalGet(builder,index_00,local_38);
  __return_storage_ptr__->getRef = (Expression *)pLVar4;
  pLVar4 = Builder::makeLocalGet(builder,index_01,(Type)(index->type).id);
  __return_storage_ptr__->getIndex = (Expression *)pLVar4;
  __return_storage_ptr__->getLength = (Expression *)pLStack_98;
  return __return_storage_ptr__;
}

Assistant:

static auto makeArrayBoundsCheck(Expression* ref,
                                 Expression* index,
                                 Function* func,
                                 Builder& builder,
                                 Expression* length = nullptr) {
  // The reference might be a RefNull, in which case its type is exact. But we
  // want to avoid creating exact-typed locals until we support them more widely
  // in the fuzzer, so adjust the type. TODO: remove this once exact references
  // are better supported.
  Type refType = ref->type;
  if (refType.isExact()) {
    refType = refType.with(Inexact);
  }
  auto tempRef = builder.addVar(func, refType);
  auto tempIndex = builder.addVar(func, index->type);
  auto* teeRef = builder.makeLocalTee(tempRef, ref, refType);
  auto* teeIndex = builder.makeLocalTee(tempIndex, index, index->type);
  auto* getSize = builder.makeArrayLen(teeRef);

  Expression* effectiveIndex = teeIndex;

  Expression* getLength = nullptr;
  if (length) {
    // Store the length so we can reuse it.
    auto tempLength = builder.addVar(func, length->type);
    auto* teeLength = builder.makeLocalTee(tempLength, length, length->type);
    // The effective index will now include the length.
    effectiveIndex = builder.makeBinary(AddInt32, effectiveIndex, teeLength);
    getLength = builder.makeLocalGet(tempLength, length->type);
  }

  struct BoundsCheck {
    // A condition that checks if the index is in bounds.
    Expression* condition;
    // An additional use of the reference (we stored the reference in a local,
    // so this reads from that local).
    Expression* getRef;
    // An additional use of the index (as with the ref, it reads from a local).
    Expression* getIndex;
    // An additional use of the length, if it was provided.
    Expression* getLength = nullptr;
  } result = {builder.makeBinary(LtUInt32, effectiveIndex, getSize),
              builder.makeLocalGet(tempRef, refType),
              builder.makeLocalGet(tempIndex, index->type),
              getLength};
  return result;
}